

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

PSpriteAmiga __thiscall DataSourceAmiga::get_ground_sprite(DataSourceAmiga *this,size_t index)

{
  byte bVar1;
  byte filling;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte *pbVar2;
  _func_int **pp_Var3;
  PBuffer *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  PBuffer PVar5;
  PSpriteAmiga PVar6;
  undefined1 local_38 [16];
  PBuffer data;
  
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(index + 0x60);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  PVar5 = get_data_from_catalog((DataSourceAmiga *)&data,index,4,in_RDX);
  _Var4 = PVar5.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var4._M_pi = extraout_RDX;
  }
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
         (_func_int **)0x0;
    (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    pbVar2 = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read;
    bVar1 = *pbVar2;
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = pbVar2 + 1;
    filling = pbVar2[1];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = pbVar2 + 2;
    Buffer::pop_tail((Buffer *)local_38);
    PVar6 = decode_planned_sprite
                      (this,(PBuffer *)(ulong)bVar1,(size_t)local_38,4,'\x15',filling,
                       (uint8_t *)(ulong)bVar1,false);
    _Var4 = PVar6.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if ((element_type *)local_38._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
      _Var4._M_pi = extraout_RDX_00;
    }
    pp_Var3 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
    if (pp_Var3 != (_func_int **)0x0) {
      pp_Var3[3] = (_func_int *)0x1;
      pp_Var3[4] = (_func_int *)0x0;
    }
  }
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  PVar6.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  PVar6.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar6.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::get_ground_sprite(size_t index) {
  PBuffer data = get_data_from_catalog(4, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  uint8_t filled = data->pop<uint8_t>();
  uint8_t compressed = data->pop<uint8_t>();

  PSpriteAmiga sprite = decode_planned_sprite(data->pop_tail(), 4, 21,
                                              compressed, filled, palette);

  if (sprite) {
    sprite->set_delta(1, 0);
    sprite->set_offset(0, 0);
  }

  return sprite;
}